

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O0

void Dsd_TreePrint_rec(FILE *pFile,Dsd_Node_t *pNode,int fComp,char **pInputNames,char *pOutputName,
                      int nOffset,int *pSigCounter,int fShortNames)

{
  int iVar1;
  void *__ptr;
  Dsd_Node_t *pDVar2;
  bool bVar3;
  int local_b0;
  int i;
  int fCompNew;
  int *pInputNums;
  Dsd_Node_t *pInput;
  char Buffer [100];
  int nOffset_local;
  char *pOutputName_local;
  char **pInputNames_local;
  int fComp_local;
  Dsd_Node_t *pNode_local;
  FILE *pFile_local;
  
  Buffer._92_4_ = nOffset;
  unique0x1000086b = pOutputName;
  if ((((pNode->Type != DSD_NODE_BUF) && (pNode->Type != DSD_NODE_CONST1)) &&
      (pNode->Type != DSD_NODE_PRIME)) &&
     ((pNode->Type != DSD_NODE_OR && (pNode->Type != DSD_NODE_EXOR)))) {
    __assert_fail("pNode->Type == DSD_NODE_BUF || pNode->Type == DSD_NODE_CONST1 || pNode->Type == DSD_NODE_PRIME || pNode->Type == DSD_NODE_OR || pNode->Type == DSD_NODE_EXOR"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/dsd/dsdTree.c"
                  ,0x2ab,
                  "void Dsd_TreePrint_rec(FILE *, Dsd_Node_t *, int, char **, char *, int, int *, int)"
                 );
  }
  Extra_PrintSymbols(pFile,' ',nOffset,0);
  if (fComp == 0) {
    fprintf((FILE *)pFile,"%s = ",stack0xffffffffffffffd0);
  }
  else {
    fprintf((FILE *)pFile,"NOT(%s) = ",stack0xffffffffffffffd0);
  }
  __ptr = malloc((long)pNode->nDecs << 2);
  if (pNode->Type == DSD_NODE_CONST1) {
    fprintf((FILE *)pFile," Constant 1.\n");
  }
  else if (pNode->Type == DSD_NODE_BUF) {
    if (fShortNames == 0) {
      fprintf((FILE *)pFile,"%s",pInputNames[pNode->S->index]);
    }
    else {
      fprintf((FILE *)pFile,"%d",(ulong)(pNode->S->index + 0x61));
    }
    fprintf((FILE *)pFile,"\n");
  }
  else if (pNode->Type == DSD_NODE_PRIME) {
    fprintf((FILE *)pFile,"PRIME(");
    for (local_b0 = 0; local_b0 < pNode->nDecs; local_b0 = local_b0 + 1) {
      pDVar2 = (Dsd_Node_t *)((ulong)pNode->pDecs[local_b0] & 0xfffffffffffffffe);
      bVar3 = pDVar2 != pNode->pDecs[local_b0];
      if (local_b0 != 0) {
        fprintf((FILE *)pFile,",");
      }
      if (bVar3) {
        fprintf((FILE *)pFile," NOT(");
      }
      else {
        fprintf((FILE *)pFile," ");
      }
      if (pDVar2->Type == DSD_NODE_BUF) {
        *(undefined4 *)((long)__ptr + (long)local_b0 * 4) = 0;
        if (fShortNames == 0) {
          fprintf((FILE *)pFile,"%s",pInputNames[pDVar2->S->index]);
        }
        else {
          fprintf((FILE *)pFile,"%d",(ulong)pDVar2->S->index);
        }
      }
      else {
        iVar1 = *pSigCounter;
        *pSigCounter = iVar1 + 1;
        *(int *)((long)__ptr + (long)local_b0 * 4) = iVar1;
        fprintf((FILE *)pFile,"<%d>",(ulong)*(uint *)((long)__ptr + (long)local_b0 * 4));
      }
      if (bVar3) {
        fprintf((FILE *)pFile,")");
      }
    }
    fprintf((FILE *)pFile," )\n");
    for (local_b0 = 0; local_b0 < pNode->nDecs; local_b0 = local_b0 + 1) {
      if (*(int *)((long)__ptr + (long)local_b0 * 4) != 0) {
        sprintf((char *)&pInput,"<%d>",(ulong)*(uint *)((long)__ptr + (long)local_b0 * 4));
        Dsd_TreePrint_rec(pFile,(Dsd_Node_t *)((ulong)pNode->pDecs[local_b0] & 0xfffffffffffffffe),0
                          ,pInputNames,(char *)&pInput,Buffer._92_4_ + 6,pSigCounter,fShortNames);
      }
    }
  }
  else if (pNode->Type == DSD_NODE_OR) {
    fprintf((FILE *)pFile,"OR(");
    for (local_b0 = 0; local_b0 < pNode->nDecs; local_b0 = local_b0 + 1) {
      pDVar2 = (Dsd_Node_t *)((ulong)pNode->pDecs[local_b0] & 0xfffffffffffffffe);
      bVar3 = pDVar2 != pNode->pDecs[local_b0];
      if (local_b0 != 0) {
        fprintf((FILE *)pFile,",");
      }
      if (bVar3) {
        fprintf((FILE *)pFile," NOT(");
      }
      else {
        fprintf((FILE *)pFile," ");
      }
      if (pDVar2->Type == DSD_NODE_BUF) {
        *(undefined4 *)((long)__ptr + (long)local_b0 * 4) = 0;
        if (fShortNames == 0) {
          fprintf((FILE *)pFile,"%s",pInputNames[pDVar2->S->index]);
        }
        else {
          fprintf((FILE *)pFile,"%c",(ulong)(pDVar2->S->index + 0x61));
        }
      }
      else {
        iVar1 = *pSigCounter;
        *pSigCounter = iVar1 + 1;
        *(int *)((long)__ptr + (long)local_b0 * 4) = iVar1;
        fprintf((FILE *)pFile,"<%d>",(ulong)*(uint *)((long)__ptr + (long)local_b0 * 4));
      }
      if (bVar3) {
        fprintf((FILE *)pFile,")");
      }
    }
    fprintf((FILE *)pFile," )\n");
    for (local_b0 = 0; local_b0 < pNode->nDecs; local_b0 = local_b0 + 1) {
      if (*(int *)((long)__ptr + (long)local_b0 * 4) != 0) {
        sprintf((char *)&pInput,"<%d>",(ulong)*(uint *)((long)__ptr + (long)local_b0 * 4));
        Dsd_TreePrint_rec(pFile,(Dsd_Node_t *)((ulong)pNode->pDecs[local_b0] & 0xfffffffffffffffe),0
                          ,pInputNames,(char *)&pInput,Buffer._92_4_ + 6,pSigCounter,fShortNames);
      }
    }
  }
  else if (pNode->Type == DSD_NODE_EXOR) {
    fprintf((FILE *)pFile,"EXOR(");
    for (local_b0 = 0; local_b0 < pNode->nDecs; local_b0 = local_b0 + 1) {
      pDVar2 = (Dsd_Node_t *)((ulong)pNode->pDecs[local_b0] & 0xfffffffffffffffe);
      bVar3 = pDVar2 != pNode->pDecs[local_b0];
      if (local_b0 != 0) {
        fprintf((FILE *)pFile,",");
      }
      if (bVar3) {
        fprintf((FILE *)pFile," NOT(");
      }
      else {
        fprintf((FILE *)pFile," ");
      }
      if (pDVar2->Type == DSD_NODE_BUF) {
        *(undefined4 *)((long)__ptr + (long)local_b0 * 4) = 0;
        if (fShortNames == 0) {
          fprintf((FILE *)pFile,"%s",pInputNames[pDVar2->S->index]);
        }
        else {
          fprintf((FILE *)pFile,"%c",(ulong)(pDVar2->S->index + 0x61));
        }
      }
      else {
        iVar1 = *pSigCounter;
        *pSigCounter = iVar1 + 1;
        *(int *)((long)__ptr + (long)local_b0 * 4) = iVar1;
        fprintf((FILE *)pFile,"<%d>",(ulong)*(uint *)((long)__ptr + (long)local_b0 * 4));
      }
      if (bVar3) {
        fprintf((FILE *)pFile,")");
      }
    }
    fprintf((FILE *)pFile," )\n");
    for (local_b0 = 0; local_b0 < pNode->nDecs; local_b0 = local_b0 + 1) {
      if (*(int *)((long)__ptr + (long)local_b0 * 4) != 0) {
        sprintf((char *)&pInput,"<%d>",(ulong)*(uint *)((long)__ptr + (long)local_b0 * 4));
        Dsd_TreePrint_rec(pFile,(Dsd_Node_t *)((ulong)pNode->pDecs[local_b0] & 0xfffffffffffffffe),0
                          ,pInputNames,(char *)&pInput,Buffer._92_4_ + 6,pSigCounter,fShortNames);
      }
    }
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

void Dsd_TreePrint_rec( FILE * pFile, Dsd_Node_t * pNode, int fComp, char * pInputNames[], char * pOutputName, int nOffset, int * pSigCounter, int fShortNames )
{
    char Buffer[100];
    Dsd_Node_t * pInput;
    int * pInputNums;
    int fCompNew, i;

    assert( pNode->Type == DSD_NODE_BUF || pNode->Type == DSD_NODE_CONST1 || 
        pNode->Type == DSD_NODE_PRIME || pNode->Type == DSD_NODE_OR || pNode->Type == DSD_NODE_EXOR ); 

    Extra_PrintSymbols( pFile, ' ', nOffset, 0 );
    if ( !fComp )
        fprintf( pFile, "%s = ", pOutputName );
    else
        fprintf( pFile, "NOT(%s) = ", pOutputName );
    pInputNums = ABC_ALLOC( int, pNode->nDecs );
    if ( pNode->Type == DSD_NODE_CONST1 )
    {
        fprintf( pFile, " Constant 1.\n" );
    }
    else if ( pNode->Type == DSD_NODE_BUF )
    {
        if ( fShortNames )
            fprintf( pFile, "%d", 'a' + pNode->S->index );
        else
            fprintf( pFile, "%s", pInputNames[pNode->S->index] );
        fprintf( pFile, "\n" );
    }
    else if ( pNode->Type == DSD_NODE_PRIME )
    {
        // print the line
        fprintf( pFile, "PRIME(" );
        for ( i = 0; i < pNode->nDecs; i++ )
        {
            pInput   = Dsd_Regular( pNode->pDecs[i] );
            fCompNew = (int)( pInput != pNode->pDecs[i] );
            if ( i )
                fprintf( pFile, "," );
            if ( fCompNew )
                fprintf( pFile, " NOT(" );
            else
                fprintf( pFile, " " );
            if ( pInput->Type == DSD_NODE_BUF )
            {
                pInputNums[i] = 0;
                if ( fShortNames )
                    fprintf( pFile, "%d", pInput->S->index );
                else
                    fprintf( pFile, "%s", pInputNames[pInput->S->index] );
            }
            else
            {
                pInputNums[i] = (*pSigCounter)++;
                fprintf( pFile, "<%d>", pInputNums[i] );
            }
            if ( fCompNew )
                fprintf( pFile, ")" );
        }
        fprintf( pFile, " )\n" );
        // call recursively for the following blocks
        for ( i = 0; i < pNode->nDecs; i++ )
            if ( pInputNums[i] )
            {
                pInput   = Dsd_Regular( pNode->pDecs[i] );
                sprintf( Buffer, "<%d>", pInputNums[i] );
                Dsd_TreePrint_rec( pFile, Dsd_Regular( pNode->pDecs[i] ), 0, pInputNames, Buffer, nOffset + 6, pSigCounter, fShortNames );
            }
    }
    else if ( pNode->Type == DSD_NODE_OR )
    {
        // print the line
        fprintf( pFile, "OR(" );
        for ( i = 0; i < pNode->nDecs; i++ )
        {
            pInput = Dsd_Regular( pNode->pDecs[i] );
            fCompNew  = (int)( pInput != pNode->pDecs[i] );
            if ( i )
                fprintf( pFile, "," );
            if ( fCompNew )
                fprintf( pFile, " NOT(" );
            else
                fprintf( pFile, " " );
            if ( pInput->Type == DSD_NODE_BUF )
            {
                pInputNums[i] = 0;
                if ( fShortNames )
                    fprintf( pFile, "%c", 'a' + pInput->S->index );
                else
                    fprintf( pFile, "%s", pInputNames[pInput->S->index] );
            }
            else
            {
                pInputNums[i] = (*pSigCounter)++;
                fprintf( pFile, "<%d>", pInputNums[i] );
            }
            if ( fCompNew )
                fprintf( pFile, ")" );
        }
        fprintf( pFile, " )\n" );
        // call recursively for the following blocks
        for ( i = 0; i < pNode->nDecs; i++ )
            if ( pInputNums[i] )
            {
                pInput = Dsd_Regular( pNode->pDecs[i] );
                sprintf( Buffer, "<%d>", pInputNums[i] );
                Dsd_TreePrint_rec( pFile, Dsd_Regular( pNode->pDecs[i] ), 0, pInputNames, Buffer, nOffset + 6, pSigCounter, fShortNames );
            }
    }
    else if ( pNode->Type == DSD_NODE_EXOR )
    {
        // print the line
        fprintf( pFile, "EXOR(" );
        for ( i = 0; i < pNode->nDecs; i++ )
        {
            pInput = Dsd_Regular( pNode->pDecs[i] );
            fCompNew  = (int)( pInput != pNode->pDecs[i] );
            if ( i )
                fprintf( pFile, "," );
            if ( fCompNew )
                fprintf( pFile, " NOT(" );
            else
                fprintf( pFile, " " );
            if ( pInput->Type == DSD_NODE_BUF )
            {
                pInputNums[i] = 0;
                if ( fShortNames )
                    fprintf( pFile, "%c", 'a' + pInput->S->index );
                else
                    fprintf( pFile, "%s", pInputNames[pInput->S->index] );
            }
            else
            {
                pInputNums[i] = (*pSigCounter)++;
                fprintf( pFile, "<%d>", pInputNums[i] );
            }
            if ( fCompNew )
                fprintf( pFile, ")" );
        }
        fprintf( pFile, " )\n" );
        // call recursively for the following blocks
        for ( i = 0; i < pNode->nDecs; i++ )
            if ( pInputNums[i] )
            {
                pInput = Dsd_Regular( pNode->pDecs[i] );
                sprintf( Buffer, "<%d>", pInputNums[i] );
                Dsd_TreePrint_rec( pFile, Dsd_Regular( pNode->pDecs[i] ), 0, pInputNames, Buffer, nOffset + 6, pSigCounter, fShortNames );
            }
    }
    ABC_FREE( pInputNums );
}